

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void setPragmaResultColumnNames(Vdbe *v,PragmaName *pPragma)

{
  byte bVar1;
  uint nResColumn;
  long lVar2;
  char **ppcVar3;
  
  bVar1 = pPragma->nPragCName;
  nResColumn = 1;
  if (1 < bVar1) {
    nResColumn = (uint)bVar1;
  }
  sqlite3VdbeSetNumCols(v,nResColumn);
  if ((ulong)bVar1 == 0) {
    if (v->db->mallocFailed == '\0') {
      sqlite3VdbeMemSetStr(v->aColName,pPragma->zName,-1,'\x01',(_func_void_void_ptr *)0x0);
      return;
    }
  }
  else {
    ppcVar3 = pragCName + pPragma->iPragCName;
    lVar2 = 0;
    do {
      if (v->db->mallocFailed == '\0') {
        sqlite3VdbeMemSetStr
                  ((Mem *)((long)&v->aColName->u + lVar2),*ppcVar3,-1,'\x01',
                   (_func_void_void_ptr *)0x0);
      }
      lVar2 = lVar2 + 0x38;
      ppcVar3 = ppcVar3 + 1;
    } while ((ulong)bVar1 * 0x38 - lVar2 != 0);
  }
  return;
}

Assistant:

static void setPragmaResultColumnNames(
  Vdbe *v,                     /* The query under construction */
  const PragmaName *pPragma    /* The pragma */
){
  u8 n = pPragma->nPragCName;
  sqlite3VdbeSetNumCols(v, n==0 ? 1 : n);
  if( n==0 ){
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, pPragma->zName, SQLITE_STATIC);
  }else{
    int i, j;
    for(i=0, j=pPragma->iPragCName; i<n; i++, j++){
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, pragCName[j], SQLITE_STATIC);
    }
  }
}